

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buckets.hpp
# Opt level: O2

unsigned_long
boost::unordered::detail::mix64_policy<unsigned_long>::new_bucket_count(unsigned_long min)

{
  ulong uVar1;
  
  if (min < 5) {
    return 4;
  }
  uVar1 = min - 1 >> 1 | min - 1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  return (uVar1 >> 0x20 | uVar1) + 1;
}

Assistant:

static inline SizeT new_bucket_count(SizeT min) {
            if (min <= 4) return 4;
            --min;
            min |= min >> 1;
            min |= min >> 2;
            min |= min >> 4;
            min |= min >> 8;
            min |= min >> 16;
            min |= min >> 32;
            return min + 1;
        }